

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

Log * __thiscall FIX::ScreenLogFactory::create(ScreenLogFactory *this,SessionID *sessionID)

{
  bool bVar1;
  Dictionary *pDVar2;
  ScreenLog *this_00;
  bool event;
  bool outgoing;
  bool incoming;
  Dictionary settings;
  bool local_73;
  bool local_72;
  bool local_71;
  undefined1 local_70 [56];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_70._32_8_ = local_70 + 0x10;
  local_70._0_8_ = &PTR__Dictionary_001f5658;
  local_70._16_4_ = _S_red;
  local_70._24_8_ = (_Base_ptr)0x0;
  local_70._48_8_ = 0;
  local_38._M_p = (pointer)&local_28;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_70._40_8_ = local_70._32_8_;
  bVar1 = SessionSettings::has(&this->m_settings,sessionID);
  if (bVar1) {
    pDVar2 = SessionSettings::get(&this->m_settings,sessionID);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_70 + 8),&(pDVar2->m_data)._M_t);
    std::__cxx11::string::_M_assign((string *)&local_38);
  }
  init(this,(EVP_PKEY_CTX *)local_70);
  this_00 = (ScreenLog *)operator_new(0x48);
  ScreenLog::ScreenLog(this_00,sessionID,local_71,local_72,local_73);
  Dictionary::~Dictionary((Dictionary *)local_70);
  return &this_00->super_Log;
}

Assistant:

Log *ScreenLogFactory::create(const SessionID &sessionID) {
  Dictionary settings;
  if (m_settings.has(sessionID)) {
    settings = m_settings.get(sessionID);
  }

  bool incoming, outgoing, event;
  init(settings, incoming, outgoing, event);
  return new ScreenLog(sessionID, incoming, outgoing, event);
}